

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loadable_extension_demo.cpp
# Opt level: O2

BoundedType * __thiscall BoundedType::Bind(BoundedType *this,BindLogicalTypeInput *input)

{
  vector<duckdb::Value,_true> *this_00;
  bool bVar1;
  int max_val;
  const_reference pvVar2;
  BinderException *pBVar3;
  allocator local_49;
  LogicalType local_48 [32];
  
  this_00 = input->modifiers;
  if ((long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this_00->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start != 0x40) {
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)local_48,"BOUNDED type must have one modifier",&local_49)
    ;
    duckdb::BinderException::BinderException(pBVar3,(string *)local_48);
    __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pvVar2 = duckdb::vector<duckdb::Value,_true>::get<true>(this_00,0);
  duckdb::LogicalType::LogicalType(local_48,INTEGER);
  bVar1 = duckdb::LogicalType::operator!=((LogicalType *)pvVar2,local_48);
  duckdb::LogicalType::~LogicalType(local_48);
  if (!bVar1) {
    pvVar2 = duckdb::vector<duckdb::Value,_true>::get<true>(this_00,0);
    if (pvVar2[0x18] != (value_type)0x1) {
      duckdb::vector<duckdb::Value,_true>::get<true>(this_00,0);
      max_val = duckdb::Value::GetValue<int>();
      Get(this,max_val);
      return this;
    }
    pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)local_48,"BOUNDED type modifier cannot be NULL",&local_49);
    duckdb::BinderException::BinderException(pBVar3,(string *)local_48);
    __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
  }
  pBVar3 = (BinderException *)__cxa_allocate_exception(0x10);
  std::__cxx11::string::string((string *)local_48,"BOUNDED type modifier must be integer",&local_49)
  ;
  duckdb::BinderException::BinderException(pBVar3,(string *)local_48);
  __cxa_throw(pBVar3,&duckdb::BinderException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static LogicalType Bind(const BindLogicalTypeInput &input) {
		auto &modifiers = input.modifiers;

		if (modifiers.size() != 1) {
			throw BinderException("BOUNDED type must have one modifier");
		}
		if (modifiers[0].type() != LogicalType::INTEGER) {
			throw BinderException("BOUNDED type modifier must be integer");
		}
		if (modifiers[0].IsNull()) {
			throw BinderException("BOUNDED type modifier cannot be NULL");
		}
		auto bound_val = modifiers[0].GetValue<int32_t>();
		return Get(bound_val);
	}